

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_full.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::ReflectionFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  bool bVar1;
  uint32_t tag_00;
  int number;
  char *pcVar2;
  uint *puVar3;
  Message *this;
  Descriptor *this_00;
  Reflection *this_01;
  Data *pDVar4;
  FieldDescriptor *local_a0;
  FieldDescriptor *field;
  int field_number;
  Reflection *reflection;
  Descriptor *descriptor;
  Message *full_msg;
  uint32_t tag;
  bool must_fallback_to_generic;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint32_t has_bits_offset;
  
  msg_local = (MessageLite *)data.field_0;
  if (ptr != (char *)0x0) {
    if (table->has_bits_offset != 0) {
      puVar3 = RefAt<unsigned_int>(msg,(ulong)(uint)table->has_bits_offset);
      *puVar3 = (uint)hasbits | *puVar3;
    }
    tag_00 = TcFieldData::tag((TcFieldData *)&msg_local);
    if ((tag_00 == 0) || ((tag_00 & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&ctx->super_EpsCopyInputStream,tag_00);
      data_local.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ptr;
    }
    else {
      this = DownCastMessage<google::protobuf::Message>(msg);
      this_00 = Message::GetDescriptor(this);
      this_01 = Message::GetReflection(this);
      number = WireFormatLite::GetTagFieldNumber(tag_00);
      local_a0 = Descriptor::FindFieldByNumber(this_00,number);
      if ((local_a0 == (FieldDescriptor *)0x0) &&
         (bVar1 = Descriptor::IsExtensionNumber(this_00,number), bVar1)) {
        pDVar4 = ParseContext::data(ctx);
        if (pDVar4->pool == (DescriptorPool *)0x0) {
          local_a0 = Reflection::FindKnownExtensionByNumber(this_01,number);
        }
        else {
          pDVar4 = ParseContext::data(ctx);
          local_a0 = DescriptorPool::FindExtensionByNumber(pDVar4->pool,this_00,number);
        }
      }
      data_local.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           WireFormat::_InternalParseAndMergeField(this,ptr,ctx,(ulong)tag_00,this_01,local_a0);
    }
    return (char *)data_local.field_0.data;
  }
  pcVar2 = GenericFallback(msg,(char *)0x0,ctx,data,table,hasbits);
  return pcVar2;
}

Assistant:

const char* TcParser::ReflectionFallback(PROTOBUF_TC_PARAM_DECL) {
  bool must_fallback_to_generic = (ptr == nullptr);
  if (ABSL_PREDICT_FALSE(must_fallback_to_generic)) {
    PROTOBUF_MUSTTAIL return GenericFallback(PROTOBUF_TC_PARAM_PASS);
  }

  SyncHasbits(msg, hasbits, table);
  uint32_t tag = data.tag();
  if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
    ctx->SetLastTag(tag);
    return ptr;
  }

  auto* full_msg = DownCastMessage<Message>(msg);
  auto* descriptor = full_msg->GetDescriptor();
  auto* reflection = full_msg->GetReflection();
  int field_number = WireFormatLite::GetTagFieldNumber(tag);
  const FieldDescriptor* field = descriptor->FindFieldByNumber(field_number);

  // If that failed, check if the field is an extension.
  if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
    if (ctx->data().pool == nullptr) {
      field = reflection->FindKnownExtensionByNumber(field_number);
    } else {
      field = ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
    }
  }

  return WireFormat::_InternalParseAndMergeField(full_msg, ptr, ctx, tag,
                                                 reflection, field);
}